

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_files_list.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  _func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_string_ptr
  *getFilesListFunc;
  ostream *poVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *archivePath;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archivePaths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  string local_38 [32];
  
  lVar1 = dlopen("../libcpio-lite.so",2);
  if (lVar1 == 0) {
    pcVar3 = "Failed to load cpio-lite.so: ";
  }
  else {
    getFilesListFunc =
         (_func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_string_ptr
          *)dlsym(lVar1,"getFilesList");
    if (getFilesListFunc !=
        (_func_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_string_ptr
         *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"./testfiles/cpio_archives/directory.cpio",&local_91);
      std::__cxx11::string::string<std::allocator<char>>
                (local_58,"./testfiles/cpio_archives/onetwothree.cpio",&local_92);
      std::__cxx11::string::string<std::allocator<char>>
                (local_38,"./testfiles/cpio_archives/links_dirs_regs.cpio",&local_93);
      __l._M_len = 3;
      __l._M_array = &local_78;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&archivePaths,__l,&local_94);
      lVar1 = 0x40;
      do {
        std::__cxx11::string::~string((string *)((long)&local_78._M_dataplus._M_p + lVar1));
        lVar1 = lVar1 + -0x20;
      } while (lVar1 != -0x20);
      for (; archivePaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             archivePaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          archivePaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               archivePaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        getAndPrintFilesList
                  (getFilesListFunc,
                   archivePaths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&archivePaths);
      return 0;
    }
    pcVar3 = "Failed to find symbol \'getFilesList\': ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  pcVar3 = (char *)dlerror();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return -1;
}

Assistant:

int main() 
{
	void* handle = dlopen("../libcpio-lite.so", RTLD_NOW);
	if (handle == nullptr) {
		cout << "Failed to load cpio-lite.so: " << dlerror() << endl;		
		return -1;
	}
	auto getFilesListFunc = (decltype(&getFilesList)) dlsym(handle, "getFilesList");
	if (getFilesListFunc == nullptr) {
		cout << "Failed to find symbol 'getFilesList': " << dlerror() << endl;
		return -1;
	}

	vector<string> archivePaths{"./testfiles/cpio_archives/directory.cpio", "./testfiles/cpio_archives/onetwothree.cpio", "./testfiles/cpio_archives/links_dirs_regs.cpio"};	

	try
	{
		for (const auto& archivePath : archivePaths)
			getAndPrintFilesList(getFilesListFunc, archivePath);
		
	}
	catch (CpioException& e)
	{
		cout << e.what() << ", error type: " << e.errorType() << endl;
		return -1;
	}
	catch (PosixException& e)
	{
		cout << e.what() << ", error code: " << e.errorCode() << endl;
		return -1;
	}
}